

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

int Bac_ManFindRealNameId(Bac_Ntk_t *p,int iObj)

{
  int n;
  int iVar1;
  Bac_NameType_t BVar2;
  
  n = Bac_ObjName(p,iObj);
  iVar1 = Bac_ObjIsCi(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Bac_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacWriteVer.c"
                  ,0xf4,"int Bac_ManFindRealNameId(Bac_Ntk_t *, int)");
  }
  BVar2 = Bac_NameType(n);
  if (BVar2 == BAC_NAME_INDEX) {
    iVar1 = Abc_Lit2Var2(n);
    n = Bac_ObjName(p,iObj - iVar1);
  }
  BVar2 = Bac_NameType(n);
  if (BVar2 == BAC_NAME_INFO) {
    iVar1 = Abc_Lit2Var2(n);
    n = Vec_IntEntry(&p->vInfo,iVar1 * 3);
  }
  else {
    BVar2 = Bac_NameType(n);
    if ((BVar2 != BAC_NAME_BIN) && (BVar2 = Bac_NameType(n), BVar2 != BAC_NAME_WORD)) {
      __assert_fail("Bac_NameType(NameId) == BAC_NAME_BIN || Bac_NameType(NameId) == BAC_NAME_WORD",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacWriteVer.c"
                    ,0xf9,"int Bac_ManFindRealNameId(Bac_Ntk_t *, int)");
    }
  }
  iVar1 = Abc_Lit2Var2(n);
  return iVar1;
}

Assistant:

static inline int Bac_ManFindRealNameId( Bac_Ntk_t * p, int iObj )
{
    int NameId = Bac_ObjName(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
    if ( Bac_NameType(NameId) == BAC_NAME_INDEX )
        NameId = Bac_ObjName(p, iObj - Abc_Lit2Var2(NameId));
    if ( Bac_NameType(NameId) == BAC_NAME_INFO )
        return Bac_NtkInfoName(p, Abc_Lit2Var2(NameId));
    assert( Bac_NameType(NameId) == BAC_NAME_BIN || Bac_NameType(NameId) == BAC_NAME_WORD );
    return Abc_Lit2Var2(NameId);
}